

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationTorque::ConstraintsFbLoadForces
          (ChLinkMotorRotationTorque *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double factor_local;
  double local_1e8;
  ChVectorRef local_1e0;
  ChVector<double> *local_1c8 [2];
  ChVector<double> local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_1a0;
  Vector m_abs_torque;
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
  local_158;
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  
  dVar7 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  factor_local = factor;
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  local_1e8 = dVar7;
  ChFrame<double>::operator>>
            (&aframe1,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&aframe2,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_1e8;
  auVar8 = ZEXT816(0) << 0x40;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * 0.0;
  auVar1 = vfmadd231sd_fma(auVar9,auVar8,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar10,auVar8,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar12,auVar8,auVar3);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar11,auVar8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar11,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar11,auVar5);
  m_abs_torque.m_data[0] = auVar1._0_8_;
  m_abs_torque.m_data[1] = auVar2._0_8_;
  m_abs_torque.m_data[2] = auVar3._0_8_;
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_1b8,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2,&m_abs_torque);
  local_1c8[0] = &local_1b8;
  Eigen::operator*(&local_1a0,&factor_local,(StorageBaseType *)local_1c8);
  iVar6 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb(&local_1e0,(ChVariables *)CONCAT44(extraout_var,iVar6));
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_158,&local_1e0,3,3);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
  ::operator-=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                *)&local_158,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_1b8,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1,&m_abs_torque);
  local_1c8[0] = &local_1b8;
  Eigen::operator*(&local_1a0,&factor_local,(StorageBaseType *)local_1c8);
  iVar6 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb(&local_1e0,(ChVariables *)CONCAT44(extraout_var_00,iVar6));
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_158,&local_1e0,3,3);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
  ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                *)&local_158,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
  return;
}

Assistant:

void ChLinkMotorRotationTorque::ConstraintsFbLoadForces(double factor) {
    // compute instant torque
    double mT = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_torque = aframe2.GetA() * ChVector<>(0, 0, mT);

    Body2->Variables().Get_fb().segment(3, 3) -= factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    Body1->Variables().Get_fb().segment(3, 3) += factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
}